

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,BinaryExpression *binary_exp,void *data)

{
  int iVar1;
  pointer pSVar2;
  undefined8 uVar3;
  char *in_RDX;
  SemanticException *in_RSI;
  undefined8 in_RDI;
  ExpVarData *parent_exp_var_data;
  ExpVarData r_exp_var_data;
  ExpVarData l_exp_var_data;
  ExpVarData local_30;
  ExpType in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  ExpVarData::ExpVarData((ExpVarData *)&stack0xffffffffffffffdc,SemanticOp_Read);
  ExpVarData::ExpVarData(&local_30,SemanticOp_Read);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1929a8);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,(ExpVarData *)&stack0xffffffffffffffdc);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1929cf);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_30);
  iVar1 = *(int *)&in_RSI[1].super_Exception.field_0x10;
  if ((((iVar1 == 0x25) || (iVar1 - 0x2aU < 2)) || (iVar1 == 0x2d)) || (iVar1 == 0x2f)) {
LAB_00192ac3:
    if ((in_stack_ffffffffffffffe0 != ExpType_Unknown) &&
       (in_stack_ffffffffffffffe0 != ExpType_Number)) {
      uVar3 = __cxa_allocate_exception(0x20);
      SemanticException::SemanticException
                (in_RSI,in_RDX,
                 (TokenDetail *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      __cxa_throw(uVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
    }
    if ((local_30.exp_type_ != ExpType_Unknown) && (local_30.exp_type_ != ExpType_Number)) {
      uVar3 = __cxa_allocate_exception(0x20);
      SemanticException::SemanticException
                (in_RSI,in_RDX,
                 (TokenDetail *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      __cxa_throw(uVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
    }
    in_RDX[4] = '\x03';
    in_RDX[5] = '\0';
    in_RDX[6] = '\0';
    in_RDX[7] = '\0';
  }
  else {
    if ((iVar1 != 0x3c) && (iVar1 != 0x3e)) {
      if (iVar1 == 0x5e) goto LAB_00192ac3;
      if (iVar1 == 0x100) {
        return;
      }
      if (iVar1 == 0x10e) {
        return;
      }
      if (iVar1 - 0x118U < 2) {
        in_RDX[4] = '\x02';
        in_RDX[5] = '\0';
        in_RDX[6] = '\0';
        in_RDX[7] = '\0';
        return;
      }
      if (1 < iVar1 - 0x11aU) {
        if (iVar1 != 0x11c) {
          return;
        }
        if (((((in_stack_ffffffffffffffe0 != ExpType_Unknown) &&
              (local_30.exp_type_ != ExpType_Unknown)) &&
             ((in_stack_ffffffffffffffe0 != ExpType_String || (local_30.exp_type_ != ExpType_String)
              ))) && ((in_stack_ffffffffffffffe0 != ExpType_String ||
                      (local_30.exp_type_ != ExpType_Number)))) &&
           ((in_stack_ffffffffffffffe0 != ExpType_Number || (local_30.exp_type_ != ExpType_String)))
           ) {
          uVar3 = __cxa_allocate_exception(0x20);
          SemanticException::SemanticException
                    (in_RSI,in_RDX,
                     (TokenDetail *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
          __cxa_throw(uVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
        }
        in_RDX[4] = '\x04';
        in_RDX[5] = '\0';
        in_RDX[6] = '\0';
        in_RDX[7] = '\0';
        return;
      }
    }
    if ((in_stack_ffffffffffffffe0 != ExpType_Unknown) && (local_30.exp_type_ != ExpType_Unknown)) {
      if (in_stack_ffffffffffffffe0 != local_30.exp_type_) {
        uVar3 = __cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (in_RSI,in_RDX,
                   (TokenDetail *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        __cxa_throw(uVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
      }
      if ((in_stack_ffffffffffffffe0 != ExpType_Number) &&
         (in_stack_ffffffffffffffe0 != ExpType_String)) {
        uVar3 = __cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (in_RSI,in_RDX,
                   (TokenDetail *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        __cxa_throw(uVar3,&SemanticException::typeinfo,SemanticException::~SemanticException);
      }
    }
    in_RDX[4] = '\x02';
    in_RDX[5] = '\0';
    in_RDX[6] = '\0';
    in_RDX[7] = '\0';
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(BinaryExpression *binary_exp, void *data)
    {
        // Binary expression is read semantic
        ExpVarData l_exp_var_data{ SemanticOp_Read };
        ExpVarData r_exp_var_data{ SemanticOp_Read };
        binary_exp->left_->Accept(this, &l_exp_var_data);
        binary_exp->right_->Accept(this, &r_exp_var_data);

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        switch (binary_exp->op_token_.token_)
        {
            case '+': case '-': case '*': case '/': case '^': case '%':
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    l_exp_var_data.exp_type_ != ExpType_Number)
                    throw SemanticException("left expression of binary operator is not number",
                                            binary_exp->op_token_);
                if (r_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Number)
                    throw SemanticException("right expression of binary operator is not number",
                                            binary_exp->op_token_);
                parent_exp_var_data->exp_type_ = ExpType_Number;
                break;
            case '<': case '>': case Token_LessEqual: case Token_GreaterEqual:
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Unknown)
                {
                    if (l_exp_var_data.exp_type_ != r_exp_var_data.exp_type_)
                        throw SemanticException("compare different expression type",
                                                binary_exp->op_token_);
                    else if (l_exp_var_data.exp_type_ != ExpType_Number &&
                             l_exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("can not compare operands",
                                                binary_exp->op_token_);
                }
                parent_exp_var_data->exp_type_ = ExpType_Bool;
                break;
            case Token_Concat:
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Unknown)
                {
                    if (!((l_exp_var_data.exp_type_ == ExpType_String &&
                           r_exp_var_data.exp_type_ == ExpType_String) ||
                          (l_exp_var_data.exp_type_ == ExpType_String &&
                           r_exp_var_data.exp_type_ == ExpType_Number) ||
                          (l_exp_var_data.exp_type_ == ExpType_Number &&
                           r_exp_var_data.exp_type_ == ExpType_String)))
                        throw SemanticException("can not concat operands",
                                                binary_exp->op_token_);
                }
                parent_exp_var_data->exp_type_ = ExpType_String;
                break;
            case Token_NotEqual: case Token_Equal:
                parent_exp_var_data->exp_type_ = ExpType_Bool;
                break;
            case Token_And: case Token_Or:
                break;
            default:
                break;
        }
    }